

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::StepFile::StepFileImporter::CanRead
          (StepFileImporter *this,string *file,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *tokens [1];
  string local_50;
  char *local_30;
  
  BaseImporter::GetExtension(&local_50,file);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  bVar1 = true;
  if (iVar2 == 0) goto LAB_006591dc;
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) goto LAB_006591dc;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_006591ab;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_006591ab:
    local_30 = "ISO-10303-21";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,file,&local_30,1,200,false,false);
    goto LAB_006591dc;
  }
  bVar1 = false;
LAB_006591dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool StepFileImporter::CanRead(const std::string& file, IOSystem* pIOHandler, bool checkSig) const {
    const std::string &extension = GetExtension(file);
    if ( extension == "stp" || extension == "step" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler) {
        const char* tokens[] = { "ISO-10303-21" };
        const bool found(SearchFileHeaderForToken(pIOHandler, file, tokens, 1));
        return found;
    }

    return false;
}